

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCountLuts(Kit_DsdNtk_t *pNtk,int nLutSize)

{
  ushort uVar1;
  int iVar2;
  uint Id;
  int Counter;
  int local_c;
  
  local_c = 0;
  Id = (uint)(pNtk->Root >> 1);
  uVar1 = pNtk->nVars;
  if (Id < (uint)pNtk->nNodes + (uint)uVar1) {
    iVar2 = 0;
    if ((((uint)*pNtk->pNodes[(ulong)Id - (ulong)uVar1] & 0x1c0) != 0x40) &&
       (iVar2 = 0, ((uint)*pNtk->pNodes[(ulong)Id - (ulong)uVar1] & 0x1c0) != 0x80)) {
      Kit_DsdCountLuts_rec(pNtk,nLutSize,Id,&local_c);
      iVar2 = -1;
      if (local_c < 1000) {
        iVar2 = local_c;
      }
    }
    return iVar2;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountLuts( Kit_DsdNtk_t * pNtk, int nLutSize )
{
    int Counter = 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_VAR )
        return 0;
    Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pNtk->Root), &Counter );
    if ( Counter >= 1000 )
        return -1;
    return Counter;
}